

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxOut.cpp
# Opt level: O3

void __thiscall OpenMD::FluxOut::doFrame(FluxOut *this,int frame)

{
  iterator __position;
  Snapshot *this_00;
  pointer pdVar1;
  pointer piVar2;
  iterator __position_00;
  int iVar3;
  uint uVar4;
  long lVar5;
  double dVar6;
  SelectionSet local_28;
  
  if ((this->super_SequentialAnalyzer).evaluator1_.isDynamic_ == true) {
    SelectionEvaluator::evaluate(&local_28,&(this->super_SequentialAnalyzer).evaluator1_);
    lVar5 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->super_SequentialAnalyzer).seleMan1_.ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar5),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_28.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar5));
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_28.bitsets_);
  }
  iVar3 = OpenMDBitSet::countBits
                    ((this->super_SequentialAnalyzer).seleMan1_.ss_.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  local_28.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_28.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar3);
  __position._M_current =
       (this->counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (__position._M_current ==
      (this->counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->counts_,__position,(int *)&local_28);
  }
  else {
    *__position._M_current = iVar3;
    (this->counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  this_00 = (this->super_SequentialAnalyzer).currentSnapshot_;
  if (this->axis_ == 1) {
    dVar6 = Snapshot::getXZarea(this_00);
  }
  else if (this->axis_ == 0) {
    dVar6 = Snapshot::getYZarea(this_00);
  }
  else {
    dVar6 = Snapshot::getXYarea(this_00);
  }
  pdVar1 = (this->super_SequentialAnalyzer).times_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar4 = (uint)((long)(this->super_SequentialAnalyzer).times_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
  if (1 < (int)uVar4) {
    piVar2 = (this->counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_28.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((double)(piVar2[uVar4 & 0x7fffffff] - piVar2[uVar4 - 1]) /
                  ((pdVar1[uVar4 & 0x7fffffff] - pdVar1[uVar4 - 1]) * (dVar6 + dVar6)));
    __position_00._M_current =
         (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->values_,__position_00,(double *)&local_28);
    }
    else {
      *__position_00._M_current =
           (double)local_28.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = __position_00._M_current + 1;
    }
  }
  return;
}

Assistant:

void FluxOut::doFrame(int frame) {
    StuntDouble* sd;
    int i;
    
    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }
    
    unsigned int count1 = seleMan1_.getSelectionCount();
    counts_.push_back(count1);

    RealType area;
    switch (axis_) {
    case 0:
      area = 2.0 * currentSnapshot_->getYZarea();
      break;
    case 1:
      area = 2.0 * currentSnapshot_->getXZarea();
      break;
    case 2:
    default:
      area = 2.0 * currentSnapshot_->getXYarea();
    }

    int n = times_.size();
    if (n > 1) {
      RealType deltaT = times_[n] - times_[n-1];
      RealType deltaC = counts_[n] - counts_[n-1];      
      values_.push_back(deltaC / (area * deltaT));
    }
  }